

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *rootLG,DirectoryTarget *dt,char *pass,bool check_all,
          bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer pTVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmGeneratorTarget *this_01;
  pointer pDVar4;
  bool bVar5;
  string *a;
  cmLocalUnixMakefileGenerator3 *this_02;
  Dir *d;
  pointer a_00;
  ulong uVar6;
  undefined7 in_register_00000089;
  pointer pTVar7;
  char local_e9;
  char *pass_local;
  uint local_dc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string doc;
  string local_70;
  string makeTarget;
  
  uVar6 = CONCAT71(in_register_00000089,check_all) & 0xffffffff;
  this_00 = (cmLocalUnixMakefileGenerator3 *)dt->LG;
  pass_local = pass;
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_00);
  doc._M_dataplus._M_p._0_1_ = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,char_const*&>(&makeTarget,a,(char *)&doc,&pass_local);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar7 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (dt->Targets).
           super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Target,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Target>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_dc = (uint)CONCAT71(in_register_00000089,check_all);
  do {
    if (pTVar7 == pTVar1) {
      pDVar4 = (dt->Children).
               super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (a_00 = (dt->Children).
                  super__Vector_base<cmGlobalCommonGenerator::DirectoryTarget::Dir,_std::allocator<cmGlobalCommonGenerator::DirectoryTarget::Dir>_>
                  ._M_impl.super__Vector_impl_data._M_start; a_00 != pDVar4; a_00 = a_00 + 1) {
        if (((char)uVar6 == '\0') || (a_00->ExcludeFromAll == false)) {
          local_70._M_dataplus._M_p._0_1_ = 0x2f;
          cmStrCat<std::__cxx11::string_const&,char,char_const*&>
                    (&doc,&a_00->Path,(char *)&local_70,&pass_local);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                     &doc);
          std::__cxx11::string::~string((string *)&doc);
        }
      }
      if ((depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((this->EmptyRuleHackDepends)._M_string_length != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&this->EmptyRuleHackDepends);
      }
      doc._M_dataplus._M_p = (pointer)&doc.field_2;
      doc._M_string_length = 0;
      doc.field_2._M_local_buf[0] = '\0';
      bVar5 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this_00);
      if (bVar5) {
        cmStrCat<char_const(&)[21],char_const*&,char_const(&)[10]>
                  (&local_70,(char (*) [21])"The main recursive \"",&pass_local,
                   (char (*) [10])"\" target.");
      }
      else {
        cmStrCat<char_const(&)[12],char_const*&,char_const(&)[20]>
                  (&local_70,(char (*) [12])"Recursive \"",&pass_local,
                   (char (*) [20])"\" directory target.");
      }
      std::__cxx11::string::operator=((string *)&doc,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (rootLG,ruleFileStream,doc._M_dataplus._M_p,&makeTarget,&depends,commands,true,false
                );
      std::__cxx11::string::~string((string *)&doc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      std::__cxx11::string::~string((string *)&makeTarget);
      return;
    }
    if ((char)uVar6 == '\0') {
      if (check_relink) goto LAB_00463b9f;
LAB_00463be1:
      this_02 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(pTVar7->GT);
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                (&local_70,this_02,pTVar7->GT);
      local_e9 = '/';
      cmStrCat<std::__cxx11::string,char,char_const*&>(&doc,&local_70,&local_e9,&pass_local);
      std::__cxx11::string::~string((string *)&local_70);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,&doc)
      ;
      std::__cxx11::string::~string((string *)&doc);
    }
    else {
      pbVar2 = (pTVar7->ExcludedFromAllInConfigs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (pTVar7->ExcludedFromAllInConfigs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar2 == pbVar3 && check_relink) {
LAB_00463b9f:
        this_01 = pTVar7->GT;
        cmLocalUnixMakefileGenerator3::GetConfigName_abi_cxx11_(&doc,this_00);
        bVar5 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_01,&doc);
        std::__cxx11::string::~string((string *)&doc);
        uVar6 = (ulong)local_dc;
        if (bVar5) goto LAB_00463be1;
      }
      else if (pbVar2 == pbVar3) goto LAB_00463be1;
    }
    pTVar7 = pTVar7 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3& rootLG,
  DirectoryTarget const& dt, const char* pass, bool check_all,
  bool check_relink, std::vector<std::string> const& commands)
{
  auto* lg = static_cast<cmLocalUnixMakefileGenerator3*>(dt.LG);
  std::string makeTarget =
    cmStrCat(lg->GetCurrentBinaryDirectory(), '/', pass);

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (DirectoryTarget::Target const& t : dt.Targets) {
    // Add this to the list of depends rules in this directory.
    if ((!check_all || t.ExcludedFromAllInConfigs.empty()) &&
        (!check_relink ||
         t.GT->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
      // The target may be from a different directory; use its local gen.
      auto const* tlg = static_cast<cmLocalUnixMakefileGenerator3 const*>(
        t.GT->GetLocalGenerator());
      std::string tname =
        cmStrCat(tlg->GetRelativeTargetDirectory(t.GT), '/', pass);
      depends.push_back(std::move(tname));
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (DirectoryTarget::Dir const& d : dt.Children) {
    if (check_all && d.ExcludeFromAll) {
      continue;
    }
    std::string subdir = cmStrCat(d.Path, '/', pass);
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = cmStrCat("The main recursive \"", pass, "\" target.");
  } else {
    doc = cmStrCat("Recursive \"", pass, "\" directory target.");
  }

  rootLG.WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends,
                       commands, true);
}